

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidgetresizehandler.cpp
# Opt level: O0

void __thiscall QWidgetResizeHandler::keyPressEvent(QWidgetResizeHandler *this,QKeyEvent *e)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  bool bVar13;
  Int IVar14;
  MousePosition MVar15;
  int iVar16;
  int iVar17;
  int *piVar18;
  QKeyEvent *in_RSI;
  QWidgetResizeHandler *in_RDI;
  long in_FS_OFFSET;
  int delta;
  bool is_control;
  QPoint pos;
  undefined4 in_stack_fffffffffffffed8;
  KeyboardModifier in_stack_fffffffffffffedc;
  QWidget *in_stack_fffffffffffffee0;
  undefined4 in_stack_fffffffffffffef8;
  MousePosition MVar19;
  undefined4 in_stack_fffffffffffffefc;
  MousePosition in_stack_ffffffffffffff2c;
  MousePosition in_stack_ffffffffffffff30;
  MousePosition in_stack_ffffffffffffff34;
  QCursor local_78;
  undefined1 local_70 [16];
  QCursor local_60;
  undefined1 local_58 [16];
  QCursor local_48;
  undefined1 local_40 [16];
  QCursor local_30;
  undefined1 local_28 [16];
  undefined1 *local_18;
  undefined4 local_10;
  QFlagsStorageHelper<Qt::KeyboardModifier,_4> local_c;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  bVar13 = isResizing(in_RDI);
  if (bVar13) {
    local_10 = QKeyEvent::modifiers();
    local_c.super_QFlagsStorage<Qt::KeyboardModifier>.i =
         (QFlagsStorage<Qt::KeyboardModifier>)
         QFlags<Qt::KeyboardModifier>::operator&
                   ((QFlags<Qt::KeyboardModifier> *)in_stack_fffffffffffffee0,
                    in_stack_fffffffffffffedc);
    IVar14 = ::QFlags::operator_cast_to_unsigned_int((QFlags *)&local_c);
    MVar15 = Right;
    if (IVar14 != 0) {
      MVar15 = TopLeft;
    }
    local_18 = &DAT_aaaaaaaaaaaaaaaa;
    local_18 = (undefined1 *)QCursor::pos();
    iVar16 = QKeyEvent::key(in_RSI);
    if (((iVar16 == 0x20) || (iVar16 == 0x1000000)) || (iVar16 + 0xfefffffcU < 2)) {
      in_RDI[0x40] = (QWidgetResizeHandler)((byte)in_RDI[0x40] & 0xfd);
      QWidget::releaseMouse((QWidget *)0x66af91);
      QWidget::releaseKeyboard(in_stack_fffffffffffffee0);
      in_RDI[0x40] = (QWidgetResizeHandler)((byte)in_RDI[0x40] & 0xfe);
    }
    else if (iVar16 == 0x1000012) {
      piVar18 = QPoint::rx((QPoint *)0x66a810);
      *piVar18 = *piVar18 - MVar15;
      iVar16 = QPoint::x((QPoint *)0x66a82a);
      QGuiApplication::primaryScreen();
      local_28 = QScreen::virtualGeometry();
      iVar17 = QRect::left((QRect *)0x66a85b);
      if (iVar16 <= iVar17) {
        if ((*(int *)(in_RDI + 0x30) == 1) || (*(int *)(in_RDI + 0x30) == 3)) {
          piVar18 = QPoint::rx((QPoint *)0x66a8a4);
          *piVar18 = MVar15 + *piVar18;
          piVar18 = QPoint::rx((QPoint *)0x66a8cb);
          *piVar18 = MVar15 + *piVar18;
        }
        else {
          piVar18 = QPoint::rx((QPoint *)0x66a8f4);
          *piVar18 = *piVar18 - MVar15;
          piVar18 = QPoint::rx((QPoint *)0x66a91a);
          *piVar18 = *piVar18 - MVar15;
        }
      }
      bVar13 = isResizing(in_RDI);
      auVar10._8_8_ = local_70._8_8_;
      auVar10._0_8_ = local_70._0_8_;
      auVar7._8_8_ = local_58._8_8_;
      auVar7._0_8_ = local_58._0_8_;
      auVar4._8_8_ = local_40._8_8_;
      auVar4._0_8_ = local_40._0_8_;
      if ((bVar13) &&
         (local_40 = auVar4, local_58 = auVar7, local_70 = auVar10,
         (resizeHorizontalDirectionFixed & 1U) == 0)) {
        resizeHorizontalDirectionFixed = true;
        if (*(int *)(in_RDI + 0x30) == 2) {
          *(undefined4 *)(in_RDI + 0x30) = 3;
        }
        else if (*(int *)(in_RDI + 0x30) == 4) {
          *(undefined4 *)(in_RDI + 0x30) = 1;
        }
        setMouseCursor((QWidgetResizeHandler *)
                       CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                       in_stack_ffffffffffffff2c);
        QWidget::cursor((QWidget *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
        QWidget::grabMouse(in_stack_fffffffffffffee0,
                           (QCursor *)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8))
        ;
        QCursor::~QCursor(&local_30);
      }
    }
    else if (iVar16 == 0x1000013) {
      piVar18 = QPoint::ry((QPoint *)0x66abd7);
      *piVar18 = *piVar18 - MVar15;
      iVar16 = QPoint::y((QPoint *)0x66abee);
      QGuiApplication::primaryScreen();
      local_58 = QScreen::virtualGeometry();
      iVar17 = QRect::top((QRect *)0x66ac1c);
      if (iVar16 <= iVar17) {
        if ((*(int *)(in_RDI + 0x30) == 1) || (*(int *)(in_RDI + 0x30) == 4)) {
          piVar18 = QPoint::ry((QPoint *)0x66ac62);
          *piVar18 = MVar15 + *piVar18;
          piVar18 = QPoint::ry((QPoint *)0x66ac86);
          *piVar18 = MVar15 + *piVar18;
        }
        else {
          piVar18 = QPoint::ry((QPoint *)0x66acac);
          *piVar18 = *piVar18 - MVar15;
          piVar18 = QPoint::ry((QPoint *)0x66acd2);
          *piVar18 = *piVar18 - MVar15;
        }
      }
      bVar13 = isResizing(in_RDI);
      auVar11._8_8_ = local_70._8_8_;
      auVar11._0_8_ = local_70._0_8_;
      auVar5._8_8_ = local_40._8_8_;
      auVar5._0_8_ = local_40._0_8_;
      auVar1._8_8_ = local_28._8_8_;
      auVar1._0_8_ = local_28._0_8_;
      if ((bVar13) &&
         (local_28 = auVar1, local_40 = auVar5, local_70 = auVar11,
         (resizeVerticalDirectionFixed & 1U) == 0)) {
        resizeVerticalDirectionFixed = true;
        if (*(int *)(in_RDI + 0x30) == 3) {
          *(undefined4 *)(in_RDI + 0x30) = 1;
        }
        else if (*(int *)(in_RDI + 0x30) == 2) {
          *(undefined4 *)(in_RDI + 0x30) = 4;
        }
        setMouseCursor((QWidgetResizeHandler *)
                       CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                       in_stack_ffffffffffffff2c);
        QWidget::cursor((QWidget *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
        QWidget::grabMouse(in_stack_fffffffffffffee0,
                           (QCursor *)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8))
        ;
        QCursor::~QCursor(&local_60);
      }
    }
    else if (iVar16 == 0x1000014) {
      piVar18 = QPoint::rx((QPoint *)0x66a9fc);
      *piVar18 = MVar15 + *piVar18;
      iVar16 = QPoint::x((QPoint *)0x66aa11);
      QGuiApplication::primaryScreen();
      local_40 = QScreen::virtualGeometry();
      iVar17 = QRect::right((QRect *)0x66aa3f);
      if (iVar17 <= iVar16) {
        if ((*(int *)(in_RDI + 0x30) == 4) || (*(int *)(in_RDI + 0x30) == 2)) {
          in_stack_ffffffffffffff30 = MVar15;
          piVar18 = QPoint::rx((QPoint *)0x66aa85);
          *piVar18 = in_stack_ffffffffffffff30 + *piVar18;
          piVar18 = QPoint::rx((QPoint *)0x66aaa9);
          *piVar18 = MVar15 + *piVar18;
          in_stack_ffffffffffffff34 = MVar15;
        }
        else {
          piVar18 = QPoint::rx((QPoint *)0x66aacf);
          *piVar18 = *piVar18 - MVar15;
          piVar18 = QPoint::rx((QPoint *)0x66aaf5);
          *piVar18 = *piVar18 - MVar15;
          in_stack_ffffffffffffff2c = MVar15;
        }
      }
      bVar13 = isResizing(in_RDI);
      auVar12._8_8_ = local_70._8_8_;
      auVar12._0_8_ = local_70._0_8_;
      auVar8._8_8_ = local_58._8_8_;
      auVar8._0_8_ = local_58._0_8_;
      auVar2._8_8_ = local_28._8_8_;
      auVar2._0_8_ = local_28._0_8_;
      if ((bVar13) &&
         (local_28 = auVar2, local_58 = auVar8, local_70 = auVar12,
         (resizeHorizontalDirectionFixed & 1U) == 0)) {
        resizeHorizontalDirectionFixed = true;
        if (*(int *)(in_RDI + 0x30) == 3) {
          *(undefined4 *)(in_RDI + 0x30) = 2;
        }
        else if (*(int *)(in_RDI + 0x30) == 1) {
          *(undefined4 *)(in_RDI + 0x30) = 4;
        }
        setMouseCursor((QWidgetResizeHandler *)
                       CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                       in_stack_ffffffffffffff2c);
        QWidget::cursor((QWidget *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
        QWidget::grabMouse(in_stack_fffffffffffffee0,
                           (QCursor *)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8))
        ;
        QCursor::~QCursor(&local_48);
      }
    }
    else {
      if (iVar16 != 0x1000015) goto LAB_0066afc7;
      MVar19 = MVar15;
      piVar18 = QPoint::ry((QPoint *)0x66adb4);
      *piVar18 = MVar19 + *piVar18;
      iVar16 = QPoint::y((QPoint *)0x66adc9);
      QGuiApplication::primaryScreen();
      local_70 = QScreen::virtualGeometry();
      iVar17 = QRect::bottom((QRect *)0x66adf7);
      if (iVar17 <= iVar16) {
        if ((*(int *)(in_RDI + 0x30) == 3) || (*(int *)(in_RDI + 0x30) == 2)) {
          piVar18 = QPoint::ry((QPoint *)0x66ae3d);
          *piVar18 = MVar15 + *piVar18;
          piVar18 = QPoint::ry((QPoint *)0x66ae61);
          *piVar18 = MVar15 + *piVar18;
        }
        else {
          piVar18 = QPoint::ry((QPoint *)0x66ae87);
          *piVar18 = *piVar18 - MVar15;
          piVar18 = QPoint::ry((QPoint *)0x66aead);
          *piVar18 = *piVar18 - MVar15;
        }
      }
      bVar13 = isResizing(in_RDI);
      auVar9._8_8_ = local_58._8_8_;
      auVar9._0_8_ = local_58._0_8_;
      auVar6._8_8_ = local_40._8_8_;
      auVar6._0_8_ = local_40._0_8_;
      auVar3._8_8_ = local_28._8_8_;
      auVar3._0_8_ = local_28._0_8_;
      if ((bVar13) &&
         (local_28 = auVar3, local_40 = auVar6, local_58 = auVar9,
         (resizeVerticalDirectionFixed & 1U) == 0)) {
        resizeVerticalDirectionFixed = true;
        if (*(int *)(in_RDI + 0x30) == 1) {
          *(undefined4 *)(in_RDI + 0x30) = 3;
        }
        else if (*(int *)(in_RDI + 0x30) == 4) {
          *(undefined4 *)(in_RDI + 0x30) = 2;
        }
        setMouseCursor((QWidgetResizeHandler *)
                       CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                       in_stack_ffffffffffffff2c);
        in_stack_fffffffffffffee0 = *(QWidget **)(in_RDI + 0x10);
        QWidget::cursor((QWidget *)CONCAT44(iVar16,MVar19));
        QWidget::grabMouse(in_stack_fffffffffffffee0,
                           (QCursor *)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8))
        ;
        QCursor::~QCursor(&local_78);
      }
    }
    QCursor::setPos((QPoint *)in_stack_fffffffffffffee0);
  }
LAB_0066afc7:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QWidgetResizeHandler::keyPressEvent(QKeyEvent * e)
{
    if (!isResizing())
        return;
    bool is_control = e->modifiers() & Qt::ControlModifier;
    int delta = is_control?1:8;
    QPoint pos = QCursor::pos();
    switch (e->key()) {
    case Qt::Key_Left:
        pos.rx() -= delta;
        if (pos.x() <= QGuiApplication::primaryScreen()->virtualGeometry().left()) {
            if (mode == TopLeft || mode == BottomLeft) {
                moveOffset.rx() += delta;
                invertedMoveOffset.rx() += delta;
            } else {
                moveOffset.rx() -= delta;
                invertedMoveOffset.rx() -= delta;
            }
        }
        if (isResizing() && !resizeHorizontalDirectionFixed) {
            resizeHorizontalDirectionFixed = true;
            if (mode == BottomRight)
                mode = BottomLeft;
            else if (mode == TopRight)
                mode = TopLeft;
#ifndef QT_NO_CURSOR
            setMouseCursor(mode);
            widget->grabMouse(widget->cursor());
#else
            widget->grabMouse();
#endif
        }
        break;
    case Qt::Key_Right:
        pos.rx() += delta;
        if (pos.x() >= QGuiApplication::primaryScreen()->virtualGeometry().right()) {
            if (mode == TopRight || mode == BottomRight) {
                moveOffset.rx() += delta;
                invertedMoveOffset.rx() += delta;
            } else {
                moveOffset.rx() -= delta;
                invertedMoveOffset.rx() -= delta;
            }
        }
        if (isResizing() && !resizeHorizontalDirectionFixed) {
            resizeHorizontalDirectionFixed = true;
            if (mode == BottomLeft)
                mode = BottomRight;
            else if (mode == TopLeft)
                mode = TopRight;
#ifndef QT_NO_CURSOR
            setMouseCursor(mode);
            widget->grabMouse(widget->cursor());
#else
            widget->grabMouse();
#endif
        }
        break;
    case Qt::Key_Up:
        pos.ry() -= delta;
        if (pos.y() <= QGuiApplication::primaryScreen()->virtualGeometry().top()) {
            if (mode == TopLeft || mode == TopRight) {
                moveOffset.ry() += delta;
                invertedMoveOffset.ry() += delta;
            } else {
                moveOffset.ry() -= delta;
                invertedMoveOffset.ry() -= delta;
            }
        }
        if (isResizing() && !resizeVerticalDirectionFixed) {
            resizeVerticalDirectionFixed = true;
            if (mode == BottomLeft)
                mode = TopLeft;
            else if (mode == BottomRight)
                mode = TopRight;
#ifndef QT_NO_CURSOR
            setMouseCursor(mode);
            widget->grabMouse(widget->cursor());
#else
            widget->grabMouse();
#endif
        }
        break;
    case Qt::Key_Down:
        pos.ry() += delta;
        if (pos.y() >= QGuiApplication::primaryScreen()->virtualGeometry().bottom()) {
            if (mode == BottomLeft || mode == BottomRight) {
                moveOffset.ry() += delta;
                invertedMoveOffset.ry() += delta;
            } else {
                moveOffset.ry() -= delta;
                invertedMoveOffset.ry() -= delta;
            }
        }
        if (isResizing() && !resizeVerticalDirectionFixed) {
            resizeVerticalDirectionFixed = true;
            if (mode == TopLeft)
                mode = BottomLeft;
            else if (mode == TopRight)
                mode = BottomRight;
#ifndef QT_NO_CURSOR
            setMouseCursor(mode);
            widget->grabMouse(widget->cursor());
#else
            widget->grabMouse();
#endif
        }
        break;
    case Qt::Key_Space:
    case Qt::Key_Return:
    case Qt::Key_Enter:
    case Qt::Key_Escape:
        active = false;
        widget->releaseMouse();
        widget->releaseKeyboard();
        buttonDown = false;
        break;
    default:
        return;
    }
    QCursor::setPos(pos);
}